

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

string * serialization_pipeline<IsoForest>(IsoForest *model)

{
  string *in_RDI;
  IsoForest *unaff_retaddr;
  char **in_stack_00000008;
  IsoForest *in_stack_00000010;
  char *ptr;
  string *serialized;
  
  std::__cxx11::string::string((string *)in_RDI);
  get_size_model(unaff_retaddr);
  std::__cxx11::string::resize((ulong)in_RDI);
  std::__cxx11::string::operator[]((ulong)in_RDI);
  serialization_pipeline<IsoForest,char*>(in_stack_00000010,in_stack_00000008);
  return in_RDI;
}

Assistant:

std::string serialization_pipeline(const Model &model)
{
    std::string serialized;
    serialized.resize(get_size_model(model));
    char *ptr = &serialized[0];
    serialization_pipeline(model, ptr);
    return serialized;
}